

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O2

double despot::State::Weight(vector<despot::State_*,_std::allocator<despot::State_*>_> *particles)

{
  pointer ppSVar1;
  int i;
  long lVar2;
  double dVar3;
  
  ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  for (lVar2 = 0;
      (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3 != lVar2;
      lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + ppSVar1[lVar2]->weight;
  }
  return dVar3;
}

Assistant:

double State::Weight(const vector<State*>& particles) {
	double weight = 0;
	for (int i = 0; i < particles.size(); i++)
		weight += particles[i]->weight;
	return weight;
}